

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c,SUNMatrix A)

{
  long *plVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  
  pvVar2 = A->content;
  bVar14 = *(int *)((long)pvVar2 + 0x28) == 0;
  lVar13 = *(long *)((long)pvVar2 + (ulong)bVar14 * 8);
  lVar3 = *(long *)((long)pvVar2 + (ulong)!bVar14 * 8);
  lVar5 = *(long *)((long)pvVar2 + 0x38);
  lVar6 = *(long *)((long)pvVar2 + 0x20);
  lVar12 = 0;
  lVar8 = 0;
  if (0 < lVar13) {
    lVar8 = lVar13;
  }
  lVar7 = *(long *)((long)pvVar2 + 0x30);
  lVar9 = 0;
  while (lVar9 != lVar8) {
    lVar11 = *(long *)(lVar5 + 8 + lVar9 * 8);
    bVar14 = false;
    for (lVar10 = *(long *)(lVar5 + lVar9 * 8); lVar10 < lVar11; lVar10 = lVar10 + 1) {
      dVar15 = *(double *)(lVar6 + lVar10 * 8) * c;
      if (*(long *)(lVar7 + lVar10 * 8) == lVar9) {
        bVar14 = true;
        dVar15 = dVar15 + 1.0;
      }
      *(double *)(lVar6 + lVar10 * 8) = dVar15;
    }
    lVar12 = lVar12 + (ulong)(lVar9 < lVar3 && !bVar14);
    lVar9 = lVar9 + 1;
  }
  lVar8 = *(long *)(lVar5 + lVar13 * 8) + lVar12;
  if (*(long *)((long)pvVar2 + 0x10) < lVar8) {
    SUNSparseMatrix_Reallocate(A,lVar8);
    pvVar2 = A->content;
    lVar5 = *(long *)((long)pvVar2 + 0x38);
    lVar6 = *(long *)((long)pvVar2 + 0x20);
    lVar7 = *(long *)((long)pvVar2 + 0x30);
  }
  lVar8 = lVar6 + lVar12 * 8 + -8;
  lVar9 = lVar7 + lVar12 * 8 + -8;
  while (lVar10 = lVar13, 0 < lVar12) {
    lVar13 = lVar10 + -1;
    lVar11 = *(long *)(lVar5 + lVar10 * 8);
    bVar14 = false;
    while (lVar4 = *(long *)(lVar5 + lVar13 * 8), lVar4 < lVar11) {
      lVar4 = *(long *)(lVar7 + -8 + lVar11 * 8);
      *(long *)(lVar9 + lVar11 * 8) = lVar4;
      *(undefined8 *)(lVar8 + lVar11 * 8) = *(undefined8 *)(lVar6 + -8 + lVar11 * 8);
      lVar11 = lVar11 + -1;
      if (lVar4 == lVar13) {
        bVar14 = true;
      }
    }
    plVar1 = (long *)(lVar5 + lVar10 * 8);
    *plVar1 = *plVar1 + lVar12;
    if ((!bVar14) && (lVar10 <= lVar3)) {
      lVar4 = lVar4 + lVar12;
      lVar12 = lVar12 + -1;
      *(long *)(lVar7 + (lVar4 + -1) * 8) = lVar13;
      *(undefined8 *)(lVar6 + (*(long *)(lVar5 + lVar13 * 8) + lVar12) * 8) = 0x3ff0000000000000;
      lVar8 = lVar8 + -8;
      lVar9 = lVar9 + -8;
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c, SUNMatrix A)
{
  SUNFunctionBegin(A->sunctx);
  const sunindextype N = SM_SPARSETYPE_S(A) == CSC_MAT ? SM_COLUMNS_S(A)
                                                       : SM_ROWS_S(A);
  const sunindextype M = SM_SPARSETYPE_S(A) == CSC_MAT ? SM_ROWS_S(A)
                                                       : SM_COLUMNS_S(A);

  sunindextype* Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  sunindextype* Ai = SM_INDEXVALS_S(A);
  SUNAssert(Ai, SUN_ERR_ARG_CORRUPT);
  sunrealtype* Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  sunindextype newvals = 0;
  for (sunindextype j = 0; j < N; j++)
  {
    /* scan column (row if CSR) of A, searching for diagonal value */
    sunbooleantype found = SUNFALSE;
    for (sunindextype i = Ap[j]; i < Ap[j + 1]; i++)
    {
      if (Ai[i] == j)
      {
        found = SUNTRUE;
        Ax[i] = ONE + c * Ax[i];
      }
      else { Ax[i] *= c; }
    }
    /* If no diagonal element found and the current column (row) can actually
     * contain a diagonal element, increment the storage counter */
    if (!found && j < M) { newvals++; }
  }

  /* At this point, A has the correctly updated values except for any new
   * diagonal elements that need to be added (of which there are newvals). Now,
   * we allocate additional storage if needed */
  const sunindextype new_nnz = Ap[N] + newvals;
  if (new_nnz > SM_NNZ_S(A))
  {
    SUNCheckCall(SUNSparseMatrix_Reallocate(A, new_nnz));
    Ap = SM_INDEXPTRS_S(A);
    Ai = SM_INDEXVALS_S(A);
    Ax = SM_DATA_S(A);
  }

  for (sunindextype j = N - 1; newvals > 0; j--)
  {
    sunbooleantype found = SUNFALSE;
    for (sunindextype i = Ap[j + 1] - 1; i >= Ap[j]; i--)
    {
      if (Ai[i] == j) { found = SUNTRUE; }

      /* Shift elements to make room for diagonal elements */
      Ai[i + newvals] = Ai[i];
      Ax[i + newvals] = Ax[i];
    }

    Ap[j + 1] += newvals;
    if (!found && j < M)
    {
      /* This column (row) needs a diagonal element added */
      newvals--;
      Ai[Ap[j] + newvals] = j;
      Ax[Ap[j] + newvals] = ONE;
    }
  }

  return SUN_SUCCESS;
}